

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O2

void __thiscall CADFile::CADFile(CADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  vector<BRDPart,_std::allocator<BRDPart>_> *this_00;
  byte bVar1;
  BRDPartMountingSide BVar2;
  pointer __src;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  _Alloc_hider _Var6;
  CADFile *pCVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  mapped_type *pmVar13;
  byte *pbVar14;
  size_t __n;
  ulong uVar15;
  pointer ppcVar16;
  byte *pbVar17;
  byte *pbVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  double dVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  char *local_1c0;
  allocator<char> local_1b1;
  CADFile *local_1b0;
  BRDPart part;
  vector<char_*,_std::allocator<char_*>_> lines;
  key_type local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *arena;
  char *local_d0;
  vector<BRDNail,_std::allocator<BRDNail>_> *local_c8;
  char *local_c0;
  vector<BRDPin,_std::allocator<BRDPin>_> *local_b8;
  pointer local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_002033e8;
  uVar15 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_d0 = setlocale(1,"C");
  local_1b0 = this;
  if (uVar15 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
               ,&local_1b1);
    pCVar7 = local_1b0;
    std::operator+(&local_110,&local_88,":");
    std::__cxx11::to_string(&local_a8,0x29);
    std::operator+(&local_1e0,&local_110,&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                   &local_1e0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                   "CADFile::CADFile(std::vector<char> &)");
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                   ": Assertion `");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                   &local_130,"buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                   "\' failed.");
    std::__cxx11::string::operator=
              ((string *)&(pCVar7->super_BRDFileBase).error_msg,(string *)&part);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)&parts_id);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&lines);
    std::__cxx11::string::~string((string *)&arena);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_88);
    SDL_LogError(1,"%s",(pCVar7->super_BRDFileBase).error_msg._M_dataplus._M_p);
  }
  else {
    sVar12 = (uVar15 + 1) * 3;
    pcVar10 = (char *)calloc(1,sVar12);
    (this->super_BRDFileBase).file_buf = pcVar10;
    if (pcVar10 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
                 ,&local_1b1);
      pCVar7 = local_1b0;
      std::operator+(&local_110,&local_88,":");
      std::__cxx11::to_string(&local_a8,0x2c);
      std::operator+(&local_1e0,&local_110,&local_a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                     &local_1e0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                     "CADFile::CADFile(std::vector<char> &)");
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     ": Assertion `");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                     &local_130,"file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                     "\' failed.");
      std::__cxx11::string::operator=
                ((string *)&(pCVar7->super_BRDFileBase).error_msg,(string *)&part);
      std::__cxx11::string::~string((string *)&part);
      std::__cxx11::string::~string((string *)&parts_id);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&lines);
      std::__cxx11::string::~string((string *)&arena);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_88);
      SDL_LogError(1,"%s",(pCVar7->super_BRDFileBase).error_msg._M_dataplus._M_p);
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar10,__src,__n);
      }
      pCVar7 = local_1b0;
      pcVar10[uVar15] = '\0';
      arena = pcVar10 + uVar15 + 1;
      pcVar10[sVar12 - 1] = '\0';
      parts_id._M_h._M_buckets = &parts_id._M_h._M_single_bucket;
      parts_id._M_h._M_bucket_count = 1;
      parts_id._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      parts_id._M_h._M_element_count = 0;
      parts_id._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      parts_id._M_h._M_rehash_policy._M_next_resize = 0;
      parts_id._M_h._M_single_bucket = (__node_base_ptr)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar10,&lines);
      local_1c0 = pcVar10 + (sVar12 - 1);
      local_b0 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_c8 = &(pCVar7->super_BRDFileBase).nails;
      this_00 = &(pCVar7->super_BRDFileBase).parts;
      local_b8 = &(pCVar7->super_BRDFileBase).pins;
      iVar9 = 1;
      for (ppcVar16 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; pCVar7 = local_1b0, ppcVar16 != local_b0;
          ppcVar16 = ppcVar16 + 1) {
        pbVar14 = (byte *)*ppcVar16;
        pbVar18 = pbVar14 + -1;
        do {
          pbVar14 = pbVar14 + 1;
          bVar1 = pbVar18[1];
          pbVar18 = pbVar18 + 1;
          iVar8 = isspace((uint)bVar1);
        } while (iVar8 != 0);
        if (bVar1 != 0) {
          iVar9 = strncmp((char *)pbVar18,"COMP",4);
          if (iVar9 == 0) {
            part.name = (char *)0x0;
            part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
            part.mfgcode._M_string_length = 0;
            part.mfgcode.field_2._M_allocated_capacity =
                 part.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
            part.p1.y = 0;
            part.p2.x = 0;
            part.p2.y = 0;
            part.mounting_side = Both;
            part.part_type = SMD;
            part.end_of_pins = 0;
            part.p1.x = 0;
            while ((uVar20 = (uint)*pbVar18, local_1e0._M_dataplus._M_p = (pointer)pbVar18,
                   *pbVar18 != 0 && (iVar9 = isspace(uVar20), iVar9 != 0))) {
              pbVar18 = pbVar18 + 1;
              pbVar14 = pbVar14 + 1;
            }
            while ((pbVar17 = pbVar14, (char)uVar20 != '\0' && (iVar9 = isspace(uVar20), iVar9 == 0)
                   )) {
              uVar20 = (uint)*pbVar17;
              pbVar14 = pbVar17 + 1;
              local_1e0._M_dataplus._M_p = (pointer)pbVar17;
            }
            pbVar17[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8((char *)pbVar18,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            part.name = fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            pcVar10 = fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            _Var19._M_p = local_1e0._M_dataplus._M_p;
            while( true ) {
              _Var6._M_p = local_1e0._M_dataplus._M_p;
              _Var19._M_p = _Var19._M_p + 1;
              uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
              if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
              break;
              local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
            }
            while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                   (iVar9 = isspace(uVar20), iVar9 == 0))) {
              uVar20 = (uint)*pbVar18;
              _Var19._M_p = (pointer)(pbVar18 + 1);
              local_1e0._M_dataplus._M_p = (pointer)pbVar18;
            }
            pbVar18[-1] = 0;
            local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
            fix_to_utf8(_Var6._M_p,&arena,local_1c0);
            part.mounting_side = 1;
            if (*pcVar10 == '1') {
              part.mounting_side = (pcVar10[1] == '\0') + 1;
            }
            part.part_type = SMD;
            part.end_of_pins = 0;
            std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(this_00,&part);
            pBVar3 = (local_1b0->super_BRDFileBase).parts.
                     super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pBVar4 = (local_1b0->super_BRDFileBase).parts.
                     super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,part.name,(allocator<char> *)&local_110);
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&parts_id,&local_130);
            *pmVar13 = (mapped_type)(((long)pBVar3 - (long)pBVar4) / 0x48);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&part.mfgcode);
            iVar9 = 2;
          }
          else {
            iVar9 = strncmp((char *)pbVar18,"C_PIN",5);
            if (iVar9 == 0) {
              part.mfgcode._M_string_length = part.mfgcode._M_string_length & 0xffffffff00000000;
              part.name = (char *)0x0;
              part.mfgcode._M_dataplus._M_p = (pointer)0x0;
              part.mfgcode.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_72a25;
              part.mfgcode.field_2._8_8_ = 0x3fe0000000000000;
              part.mounting_side = Both;
              part.part_type = SMD;
              part.end_of_pins = 0;
              part.p1.x = 0;
              while ((uVar20 = (uint)*pbVar18, local_1e0._M_dataplus._M_p = (pointer)pbVar18,
                     *pbVar18 != 0 && (iVar9 = isspace(uVar20), iVar9 != 0))) {
                pbVar18 = pbVar18 + 1;
                pbVar14 = pbVar14 + 1;
              }
              while ((pbVar17 = pbVar14, (char)uVar20 != '\0' &&
                     (iVar9 = isspace(uVar20), iVar9 == 0))) {
                uVar20 = (uint)*pbVar17;
                pbVar14 = pbVar17 + 1;
                local_1e0._M_dataplus._M_p = (pointer)pbVar17;
              }
              pbVar17[-1] = 0;
              local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
              fix_to_utf8((char *)pbVar18,&arena,local_1c0);
              _Var19._M_p = local_1e0._M_dataplus._M_p;
              while( true ) {
                _Var6._M_p = local_1e0._M_dataplus._M_p;
                _Var19._M_p = _Var19._M_p + 1;
                uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
                if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
                break;
                local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
              }
              while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                     (iVar9 = isspace(uVar20), iVar9 == 0))) {
                uVar20 = (uint)*pbVar18;
                _Var19._M_p = (pointer)(pbVar18 + 1);
                local_1e0._M_dataplus._M_p = (pointer)pbVar18;
              }
              pbVar18[-1] = 0;
              local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
              pcVar10 = fix_to_utf8(_Var6._M_p,&arena,local_1c0);
              pcVar11 = strchr(pcVar10,0x2d);
              if (pcVar11 != (char *)0x0) {
                *pcVar11 = '\0';
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_130,pcVar10,(allocator<char> *)&local_110);
              pmVar13 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&parts_id,&local_130);
              part.mfgcode._M_dataplus._M_p._4_4_ = *pmVar13;
              std::__cxx11::string::~string((string *)&local_130);
              dVar21 = strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
              part.name = (char *)CONCAT44(part.name._4_4_,(int)(dVar21 * 1000.0));
              dVar21 = strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
              part.name = (char *)CONCAT44((int)(dVar21 * 1000.0),part.name._0_4_);
              strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
              strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
              strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
              _Var19._M_p = local_1e0._M_dataplus._M_p;
              while( true ) {
                _Var6._M_p = local_1e0._M_dataplus._M_p;
                _Var19._M_p = _Var19._M_p + 1;
                uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
                if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
                break;
                local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
              }
              while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                     (iVar9 = isspace(uVar20), iVar9 == 0))) {
                uVar20 = (uint)*pbVar18;
                _Var19._M_p = (pointer)(pbVar18 + 1);
                local_1e0._M_dataplus._M_p = (pointer)pbVar18;
              }
              pbVar18[-1] = 0;
              local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
              fix_to_utf8(_Var6._M_p,&arena,local_1c0);
              _Var19._M_p = local_1e0._M_dataplus._M_p;
              while( true ) {
                _Var6._M_p = local_1e0._M_dataplus._M_p;
                _Var19._M_p = _Var19._M_p + 1;
                uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
                if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
                break;
                local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
              }
              while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                     (iVar9 = isspace(uVar20), iVar9 == 0))) {
                uVar20 = (uint)*pbVar18;
                _Var19._M_p = (pointer)(pbVar18 + 1);
                local_1e0._M_dataplus._M_p = (pointer)pbVar18;
              }
              pbVar18[-1] = 0;
              local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
              pcVar10 = fix_to_utf8(_Var6._M_p,&arena,local_1c0);
              pcVar11 = strchr(pcVar10,0x2f);
              if (pcVar11 != (char *)0x0) {
                sVar12 = strlen(pcVar10);
                memmove(pcVar10,pcVar10 + 1,sVar12);
              }
              BVar2 = (this_00->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>)._M_impl.
                      super__Vector_impl_data._M_start[part.mfgcode._M_dataplus._M_p._4_4_ - 1].
                      mounting_side;
              if (BVar2 < (Top|Bottom)) {
                part.mfgcode._M_string_length = CONCAT44(part.mfgcode._M_string_length._4_4_,BVar2);
              }
              part.mfgcode.field_2._M_allocated_capacity = (size_type)pcVar10;
              std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back(local_b8,(value_type *)&part);
              iVar9 = 3;
            }
            else {
              iVar9 = strncmp((char *)pbVar18,"NET ",4);
              if (iVar9 == 0) {
                while ((uVar20 = (uint)*pbVar18, local_1e0._M_dataplus._M_p = (pointer)pbVar18,
                       *pbVar18 != 0 && (iVar9 = isspace(uVar20), iVar9 != 0))) {
                  pbVar18 = pbVar18 + 1;
                  pbVar14 = pbVar14 + 1;
                }
                while ((pbVar17 = pbVar14, (char)uVar20 != '\0' &&
                       (iVar9 = isspace(uVar20), iVar9 == 0))) {
                  uVar20 = (uint)*pbVar17;
                  pbVar14 = pbVar17 + 1;
                  local_1e0._M_dataplus._M_p = (pointer)pbVar17;
                }
                pbVar17[-1] = 0;
                local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
                fix_to_utf8((char *)pbVar18,&arena,local_1c0);
                _Var19._M_p = local_1e0._M_dataplus._M_p;
                while( true ) {
                  _Var6._M_p = local_1e0._M_dataplus._M_p;
                  _Var19._M_p = _Var19._M_p + 1;
                  uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
                  if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
                  break;
                  local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
                }
                while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                       (iVar9 = isspace(uVar20), iVar9 == 0))) {
                  uVar20 = (uint)*pbVar18;
                  _Var19._M_p = (pointer)(pbVar18 + 1);
                  local_1e0._M_dataplus._M_p = (pointer)pbVar18;
                }
                pbVar18[-1] = 0;
                local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
                pcVar10 = fix_to_utf8(_Var6._M_p,&arena,local_1c0);
                pcVar11 = strchr(pcVar10,0x2f);
                local_c0 = pcVar10;
                if (pcVar11 != (char *)0x0) {
                  sVar12 = strlen(pcVar10);
                  memmove(pcVar10,pcVar10 + 1,sVar12);
                }
                iVar9 = 4;
              }
              else {
                iVar8 = strncmp((char *)pbVar18,"N_VIA",5);
                iVar9 = 0;
                if (iVar8 == 0) {
                  part.name = (char *)0x0;
                  part.mfgcode._M_dataplus._M_p = (pointer)0x0;
                  part.mfgcode._M_string_length = (size_type)local_c0;
                  while ((uVar20 = (uint)*pbVar18, local_1e0._M_dataplus._M_p = (pointer)pbVar18,
                         *pbVar18 != 0 && (iVar9 = isspace(uVar20), iVar9 != 0))) {
                    pbVar18 = pbVar18 + 1;
                    pbVar14 = pbVar14 + 1;
                  }
                  while ((pbVar17 = pbVar14, (char)uVar20 != '\0' &&
                         (iVar9 = isspace(uVar20), iVar9 == 0))) {
                    uVar20 = (uint)*pbVar17;
                    pbVar14 = pbVar17 + 1;
                    local_1e0._M_dataplus._M_p = (pointer)pbVar17;
                  }
                  pbVar17[-1] = 0;
                  local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
                  fix_to_utf8((char *)pbVar18,&arena,local_1c0);
                  dVar21 = strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
                  part.name = (char *)CONCAT44((int)(dVar21 * 1000.0),part.name._0_4_);
                  dVar21 = strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
                  part.mfgcode._M_dataplus._M_p._0_4_ = (int)(dVar21 * 1000.0);
                  _Var19._M_p = local_1e0._M_dataplus._M_p;
                  while( true ) {
                    _Var6._M_p = local_1e0._M_dataplus._M_p;
                    _Var19._M_p = _Var19._M_p + 1;
                    uVar20 = (uint)(byte)*local_1e0._M_dataplus._M_p;
                    if ((*local_1e0._M_dataplus._M_p == 0) || (iVar9 = isspace(uVar20), iVar9 == 0))
                    break;
                    local_1e0._M_dataplus._M_p = _Var6._M_p + 1;
                  }
                  while ((pbVar18 = (byte *)_Var19._M_p, (char)uVar20 != '\0' &&
                         (iVar9 = isspace(uVar20), iVar9 == 0))) {
                    uVar20 = (uint)*pbVar18;
                    _Var19._M_p = (pointer)(pbVar18 + 1);
                    local_1e0._M_dataplus._M_p = (pointer)pbVar18;
                  }
                  pbVar18[-1] = 0;
                  local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p + 1;
                  fix_to_utf8(_Var6._M_p,&arena,local_1c0);
                  dVar21 = strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
                  part.mfgcode._M_dataplus._M_p._4_4_ = (dVar21 == 1.0) + 1;
                  strtod(local_1e0._M_dataplus._M_p,(char **)&local_1e0);
                  std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                            (local_c8,(value_type *)&part);
                  iVar9 = 5;
                }
              }
            }
          }
        }
      }
      gen_outline(local_1b0);
      pBVar5 = (pCVar7->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (pCVar7->super_BRDFileBase).num_parts =
           (uint)(((long)(pCVar7->super_BRDFileBase).parts.
                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pCVar7->super_BRDFileBase).parts.
                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48);
      (pCVar7->super_BRDFileBase).num_pins =
           (uint)(((long)(pCVar7->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pCVar7->super_BRDFileBase).pins.
                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
      (pCVar7->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar5 -
                         (long)(pCVar7->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (pCVar7->super_BRDFileBase).num_nails =
           (uint)(((long)(pCVar7->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pCVar7->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
      setlocale(1,local_d0);
      (pCVar7->super_BRDFileBase).valid = iVar9 != 1;
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&parts_id._M_h);
    }
  }
  return;
}

Assistant:

CADFile::CADFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	float multiplier = 1000.0f;
	char *saved_locale;
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	enum Block current_block = None;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number
	char *nailnet; // Net name for VIA

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

			if (!strncmp(line, "COMP", 4)) {
				current_block = Parts;
			} else if (!strncmp(line, "C_PIN", 5)) {
				current_block = Pins;
			} else if (!strncmp(line, "NET ", 4)) {
				current_block = Nets;
			} else if (!strncmp(line, "N_VIA", 5)) {
				current_block = Vias;
			} else {
				current_block = Invalid;
				continue;
			}
		char *p = line;
		char *s;

		switch (current_block) {
			case Parts: {
				BRDPart part;
				BRDPin pin;
				/*char *TYPE    =*/READ_STR();
				part.name       = READ_STR();
				/*char *Part(NR)=*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *X       =*/READ_STR();
				/*char *Y       =*/READ_STR();
				char *loc       = READ_STR();
				/*int *Unknown  =*/READ_STR();
				part.part_type  = BRDPartType::SMD;
				if (!strcmp(loc, "1"))//top 1 bot 2
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case Pins: {
				BRDPin pin;
				/*char *TYPE  =*/READ_STR();
				char *part    = READ_STR();
				char *ptr;
				ptr = strchr(part, '-'); //remove all after
				if (ptr != NULL)         //
					{*ptr = '\0';}       //
				pin.part       = parts_id.at(part);
				double posx    = READ_DOUBLE();
				pin.pos.x      = posx * multiplier;
				double posy    = READ_DOUBLE();
				pin.pos.y      = posy * multiplier;
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				pin.net        = netr;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case Nets: {
				/*char *TYPE  =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				nailnet        = netr;
			} break;
			case Vias: {
				BRDNail nail;
				nail.net     = nailnet;
				/*STR *TYPE  =*/READ_STR();
				double posx  = READ_DOUBLE();
				nail.pos.x   = posx * multiplier;
				double posy  = READ_DOUBLE();
				nail.pos.y   = posy * multiplier;
				/*STR        =*/READ_STR();
				nail.side    = READ_DOUBLE() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				/*double     =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			default: continue;
		}
	}
	gen_outline();
	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != None;
}